

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_context_pool.hpp
# Opt level: O2

void __thiscall
coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>::
schedule(ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_> *this,
        Func *func,Duration dur)

{
  _Manager_type p_Var1;
  _Head_base<0UL,_asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_*,_false>
  this_00;
  __single_object timer;
  _Head_base<0UL,_asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_*,_false>
  local_50;
  _Any_data local_48;
  _Manager_type local_38;
  _Invoker_type local_30;
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
  *local_28;
  rep local_18;
  
  local_18 = dur.__r;
  std::
  make_unique<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>,asio::io_context::basic_executor_type<std::allocator<void>,0ul>&,std::chrono::duration<long,std::ratio<1l,1000000l>>&>
            ((basic_executor_type<std::allocator<void>,_0UL> *)&local_50,
             (duration<long,_std::ratio<1L,_1000000L>_> *)&this->executor_);
  this_00._M_head_impl = local_50._M_head_impl;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_38 = (_Manager_type)0x0;
  local_30 = func->_M_invoker;
  p_Var1 = (func->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_48._M_unused._0_8_ = (undefined8)*(undefined8 *)&(func->super__Function_base)._M_functor;
    local_48._8_8_ = *(undefined8 *)((long)&(func->super__Function_base)._M_functor + 8);
    (func->super__Function_base)._M_manager = (_Manager_type)0x0;
    func->_M_invoker = (_Invoker_type)0x0;
    local_38 = p_Var1;
  }
  local_28 = local_50._M_head_impl;
  local_50._M_head_impl =
       (basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
        *)0x0;
  asio::
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
  ::
  async_wait<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_include_cinatra_ylt_coro_io_io_context_pool_hpp:98:20)>
            (this_00._M_head_impl,(anon_class_40_2_328d9b3e *)&local_48);
  ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>::
  schedule(std::function<void()>,std::chrono::duration<long,std::ratio<1l,1000000l>>)::
  {lambda(auto:1)#1}::~duration((_lambda_auto_1__1_ *)local_48._M_pod_data);
  std::
  unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>
  ::~unique_ptr((unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>
                 *)&local_50);
  return;
}

Assistant:

void schedule(Func func, Duration dur) override {
    auto timer = std::make_unique<asio::steady_timer>(executor_, dur);
    auto tm = timer.get();
    tm->async_wait([fn = std::move(func), timer = std::move(timer)](auto ec) {
      fn();
    });
  }